

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_test.cpp
# Opt level: O0

int __thiscall ot::commissioner::MockSocket::Connect(MockSocket *this,MockSocketPtr *aPeerSocket)

{
  int local_1c;
  int rval;
  MockSocketPtr *aPeerSocket_local;
  MockSocket *this_local;
  
  std::shared_ptr<ot::commissioner::MockSocket>::operator=(&this->mPeerSocket,aPeerSocket);
  (this->super_Socket).mIsConnected = true;
  local_1c = event_assign(&(this->super_Socket).mEvent,(this->super_Socket).mEventBase,-1,0x10,
                          Socket::HandleEvent,this);
  if (local_1c == 0) {
    local_1c = event_add(&(this->super_Socket).mEvent,(timeval *)0x0);
  }
  return local_1c;
}

Assistant:

int MockSocket::Connect(MockSocketPtr aPeerSocket)
{
    mPeerSocket  = aPeerSocket;
    mIsConnected = true;

    // Setup Event
    int rval = event_assign(&mEvent, mEventBase, -1, EV_PERSIST, HandleEvent, this);
    VerifyOrExit(rval == 0);
    VerifyOrExit((rval = event_add(&mEvent, nullptr)) == 0);

exit:
    return rval;
}